

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::Generators::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  _Var3;
  GeneratorUntypedBase *pGVar4;
  
  uVar1 = TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  _Var3._M_current = (shared_ptr<Catch::TestCaseTracking::ITracker> *)(ulong)uVar1;
  if (((this->super_TrackerBase).super_ITracker.m_children.
       super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->super_TrackerBase).super_ITracker.m_children.
       super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (_Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>*,std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>>>>,__gnu_cxx::__ops::_Iter_pred<Catch::Generators::GeneratorTracker::close()::_lambda(std::shared_ptr<Catch::TestCaseTracking::ITracker>)_1_>>
                        (),
     _Var3._M_current !=
     (this->super_TrackerBase).super_ITracker.m_children.
     super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    if ((this->super_TrackerBase).m_runState != CompletedSuccessfully) {
      return (int)_Var3._M_current;
    }
    pGVar4 = Catch::Detail::unique_ptr<Catch::Generators::GeneratorUntypedBase>::operator->
                       (&this->m_generator);
    iVar2 = (*pGVar4->_vptr_GeneratorUntypedBase[2])(pGVar4);
    if ((char)iVar2 == '\0') {
      return iVar2;
    }
  }
  std::
  vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::clear(&(this->super_TrackerBase).super_ITracker.m_children);
  (this->super_TrackerBase).m_runState = Executing;
  return extraout_EAX;
}

Assistant:

void close() override {
                TrackerBase::close();
                // If a generator has a child (it is followed by a section)
                // and none of its children have started, then we must wait
                // until later to start consuming its values.
                // This catches cases where `GENERATE` is placed between two
                // `SECTION`s.
                // **The check for m_children.empty cannot be removed**.
                // doing so would break `GENERATE` _not_ followed by `SECTION`s.
                const bool should_wait_for_child =
                    !m_children.empty() &&
                    std::find_if(m_children.begin(),
                        m_children.end(),
                        [](TestCaseTracking::ITrackerPtr tracker) {
                            return tracker->hasStarted();
                        }) == m_children.end();

                        // This check is a bit tricky, because m_generator->next()
                        // has a side-effect, where it consumes generator's current
                        // value, but we do not want to invoke the side-effect if
                        // this generator is still waiting for any child to start.
                        if (should_wait_for_child ||
                            (m_runState == CompletedSuccessfully &&
                                m_generator->next())) {
                            m_children.clear();
                            m_runState = Executing;
                        }
            }